

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.h
# Opt level: O3

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::Desc::Desc(Desc *this)

{
  (this->rowstat).data = (Status *)0x0;
  (this->rowstat).memFactor = 1.2;
  (this->rowstat).thesize = 0;
  (this->rowstat).themax = 1;
  spx_alloc<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::Desc::Status*>
            (&(this->rowstat).data,1);
  (this->colstat).data = (Status *)0x0;
  (this->colstat).memFactor = 1.2;
  (this->colstat).thesize = 0;
  (this->colstat).themax = 1;
  spx_alloc<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::Desc::Status*>
            (&(this->colstat).data,1);
  this->stat = (DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                *)0x0;
  this->costat = (DataArray<soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Desc::Status>
                  *)0x0;
  return;
}

Assistant:

Desc()
         : stat(nullptr)
         , costat(nullptr)
      {}